

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint generateFixedDistanceTree(HuffmanTree *tree)

{
  uint extraout_EAX;
  uint *bitlen;
  long lVar1;
  
  bitlen = (uint *)malloc(0x80);
  if (bitlen != (uint *)0x0) {
    for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
      bitlen[lVar1] = 5;
    }
    HuffmanTree_makeFromLengths(tree,bitlen,0x20,0xf);
    free(bitlen);
    return extraout_EAX;
  }
  return 0;
}

Assistant:

static unsigned generateFixedDistanceTree(HuffmanTree* tree)
{
	unsigned i, error = 0;
	unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DISTANCE_SYMBOLS * sizeof(unsigned));
	if (!bitlen) return 83; /*alloc fail*/

	/*there are 32 distance codes, but 30-31 are unused*/
	for (i = 0; i != NUM_DISTANCE_SYMBOLS; ++i) bitlen[i] = 5;
	error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DISTANCE_SYMBOLS, 15);

	lodepng_free(bitlen);
	return error;
}